

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineoption.cpp
# Opt level: O2

void __thiscall QCommandLineOption::setDescription(QCommandLineOption *this,QString *description)

{
  QCommandLineOptionPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QCommandLineOptionPrivate>::operator->(&this->d);
  QString::operator=(&pQVar1->description,description);
  return;
}

Assistant:

void QCommandLineOption::setDescription(const QString &description)
{
    d->description = description;
}